

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O2

int read_StreamsInfo(archive_read *a,_7z_stream_info *si)

{
  _7z_coders_info *val;
  byte bVar1;
  void *pvVar2;
  _7z_folder *p_Var3;
  int iVar4;
  uchar *puVar5;
  uint64_t *puVar6;
  uint64_t *puVar7;
  _7z_folder *p_Var8;
  _7z_coder *p_Var9;
  byte *pbVar10;
  uchar *__dest;
  anon_struct_16_2_4d417c8e *paVar11;
  uint64_t *puVar12;
  uint32_t *puVar13;
  uint uVar14;
  uint uVar15;
  unsigned_long id;
  uint64_t uVar16;
  uint i;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  size_t sVar22;
  uchar uVar23;
  ulong uVar24;
  bool bVar25;
  _7z_digests local_58;
  ulong local_40;
  void *local_38;
  
  pvVar2 = a->format->data;
  (si->ss).unpackSizes = (uint64_t *)0x0;
  (si->ss).digestsDefined = (uchar *)0x0;
  (si->ci).dataStreamIndex = 0;
  (si->ss).unpack_streams = 0;
  (si->ci).numFolders = 0;
  (si->ci).folders = (_7z_folder *)0x0;
  (si->pi).digest.digests = (uint32_t *)0x0;
  (si->pi).positions = (uint64_t *)0x0;
  (si->pi).sizes = (uint64_t *)0x0;
  (si->pi).digest.defineds = (uchar *)0x0;
  (si->pi).pos = 0;
  (si->pi).numPackStreams = 0;
  (si->ss).digests = (uint32_t *)0x0;
  puVar5 = header_bytes(a,1);
  if (puVar5 == (uchar *)0x0) {
    return -1;
  }
  uVar23 = *puVar5;
  if (uVar23 == '\x06') {
    (si->pi).digest.digests = (uint32_t *)0x0;
    (si->pi).positions = (uint64_t *)0x0;
    (si->pi).sizes = (uint64_t *)0x0;
    (si->pi).digest.defineds = (uchar *)0x0;
    (si->pi).pos = 0;
    (si->pi).numPackStreams = 0;
    iVar4 = parse_7zip_uint64(a,(uint64_t *)si);
    if (iVar4 < 0) {
      return -1;
    }
    puVar12 = &(si->pi).numPackStreams;
    iVar4 = parse_7zip_uint64(a,puVar12);
    if (iVar4 < 0) {
      return -1;
    }
    if (*puVar12 - 0xf4241 < 0xfffffffffff0bdc0) {
      return -1;
    }
    puVar5 = header_bytes(a,1);
    if (puVar5 == (uchar *)0x0) {
      return -1;
    }
    if (*puVar5 != '\0') {
      if (*puVar5 != '\t') {
        return -1;
      }
      sVar22 = (si->pi).numPackStreams;
      puVar6 = (uint64_t *)calloc(sVar22,8);
      (si->pi).sizes = puVar6;
      puVar7 = (uint64_t *)calloc(sVar22,8);
      (si->pi).positions = puVar7;
      if (puVar7 == (uint64_t *)0x0 || puVar6 == (uint64_t *)0x0) {
        return -1;
      }
      uVar14 = 0;
      while ((ulong)uVar14 < *puVar12) {
        iVar4 = parse_7zip_uint64(a,(si->pi).sizes + uVar14);
        uVar14 = uVar14 + 1;
        if (iVar4 < 0) {
          return -1;
        }
      }
      puVar5 = header_bytes(a,1);
      if (puVar5 == (uchar *)0x0) {
        return -1;
      }
      if (*puVar5 == '\0') {
        sVar22 = (si->pi).numPackStreams;
        puVar5 = (uchar *)calloc(sVar22,1);
        (si->pi).digest.defineds = puVar5;
        puVar13 = (uint32_t *)calloc(sVar22,4);
        (si->pi).digest.digests = puVar13;
        if (puVar13 == (uint32_t *)0x0 || puVar5 == (uchar *)0x0) {
          return -1;
        }
      }
      else {
        if (*puVar5 != '\t') {
          return -1;
        }
        iVar4 = read_Digests(a,&(si->pi).digest,(si->pi).numPackStreams);
        if (iVar4 < 0) {
          return -1;
        }
        puVar5 = header_bytes(a,1);
        if (puVar5 == (uchar *)0x0) {
          return -1;
        }
        if (*puVar5 != '\0') {
          return -1;
        }
      }
    }
    puVar6 = (si->pi).positions;
    if (puVar6 == (uint64_t *)0x0) {
      return -1;
    }
    puVar7 = (si->pi).sizes;
    if (puVar7 == (uint64_t *)0x0) {
      return -1;
    }
    uVar17 = (si->pi).pos;
    uVar14 = 0;
    while (uVar19 = (ulong)uVar14, uVar19 < *puVar12) {
      puVar6[uVar19] = uVar17;
      uVar17 = uVar17 + puVar7[uVar19];
      uVar14 = uVar14 + 1;
      if (*(ulong *)((long)pvVar2 + 0x80) < uVar17) {
        return -1;
      }
    }
    puVar5 = header_bytes(a,1);
    if (puVar5 == (uchar *)0x0) {
      return -1;
    }
    uVar23 = *puVar5;
  }
  if (uVar23 != '\a') {
LAB_00182812:
    if (uVar23 == '\b') {
      uVar17 = (si->ci).numFolders;
      p_Var8 = (si->ci).folders;
      (si->ss).unpack_streams = 0;
      (si->ss).unpackSizes = (uint64_t *)0x0;
      (si->ss).digestsDefined = (uchar *)0x0;
      (si->ss).digests = (uint32_t *)0x0;
      for (uVar14 = 0; uVar14 < uVar17; uVar14 = uVar14 + 1) {
        p_Var8[uVar14].numUnpackStreams = 1;
      }
      puVar5 = header_bytes(a,1);
      if (puVar5 == (uchar *)0x0) {
        return -1;
      }
      uVar23 = *puVar5;
      uVar19 = uVar17;
      if (uVar23 == '\r') {
        puVar12 = &p_Var8->numUnpackStreams;
        uVar19 = 0;
        uVar20 = uVar17;
        while (bVar25 = uVar20 != 0, uVar20 = uVar20 - 1, bVar25) {
          iVar4 = parse_7zip_uint64(a,puVar12);
          if (iVar4 < 0) {
            return -1;
          }
          if (1000000 < *puVar12) {
            return -1;
          }
          uVar19 = uVar19 + *puVar12;
          puVar12 = puVar12 + 0xd;
        }
        puVar5 = header_bytes(a,1);
        if (puVar5 == (uchar *)0x0) {
          return -1;
        }
        uVar23 = *puVar5;
      }
      (si->ss).unpack_streams = uVar19;
      if (uVar19 == 0) {
        puVar12 = (si->ss).unpackSizes;
      }
      else {
        puVar12 = (uint64_t *)calloc(uVar19,8);
        (si->ss).unpackSizes = puVar12;
        puVar5 = (uchar *)calloc(uVar19,1);
        (si->ss).digestsDefined = puVar5;
        puVar13 = (uint32_t *)calloc(uVar19,4);
        (si->ss).digests = puVar13;
        if (puVar12 == (uint64_t *)0x0) {
          return -1;
        }
        if (puVar13 == (uint32_t *)0x0 || puVar5 == (uchar *)0x0) {
          return -1;
        }
      }
      for (uVar14 = 0; uVar20 = (ulong)uVar14, uVar20 < uVar17; uVar14 = uVar14 + 1) {
        uVar18 = p_Var8[uVar20].numUnpackStreams;
        if (uVar18 != 0) {
          if (uVar23 == '\t') {
            lVar21 = 0;
            for (uVar24 = 1; uVar24 < uVar18; uVar24 = (ulong)((int)uVar24 + 1)) {
              iVar4 = parse_7zip_uint64(a,puVar12);
              if (iVar4 < 0) {
                return -1;
              }
              lVar21 = lVar21 + *puVar12;
              puVar12 = puVar12 + 1;
              uVar18 = p_Var8[uVar20].numUnpackStreams;
            }
          }
          else {
            lVar21 = 0;
          }
          uVar16 = folder_uncompressed_size(p_Var8 + uVar20);
          *puVar12 = uVar16 - lVar21;
          puVar12 = puVar12 + 1;
        }
      }
      if (uVar23 == '\t') {
        puVar5 = header_bytes(a,1);
        if (puVar5 == (uchar *)0x0) {
          return -1;
        }
        uVar23 = *puVar5;
      }
      for (uVar14 = 0; uVar20 = (ulong)uVar14, uVar20 < uVar19; uVar14 = uVar14 + 1) {
        (si->ss).digestsDefined[uVar20] = '\0';
        (si->ss).digests[uVar20] = 0;
      }
      uVar14 = 0;
      for (uVar15 = 0; uVar19 = (ulong)uVar15, uVar19 < uVar17; uVar15 = uVar15 + 1) {
        if ((p_Var8[uVar19].numUnpackStreams != 1) || (p_Var8[uVar19].digest_defined == '\0')) {
          uVar14 = uVar14 + (int)p_Var8[uVar19].numUnpackStreams;
        }
      }
      if (uVar23 == '\n') {
        puVar5 = (si->ss).digestsDefined;
        puVar13 = (si->ss).digests;
        local_58.defineds = (uchar *)0x0;
        local_58.digests = (uint32_t *)0x0;
        iVar4 = read_Digests(a,&local_58,(ulong)uVar14);
        if (iVar4 < 0) {
          free_Digest(&local_58);
          return -1;
        }
        iVar4 = 0;
        for (uVar19 = 0; uVar19 != uVar17; uVar19 = uVar19 + 1) {
          uVar16 = p_Var8[uVar19].numUnpackStreams;
          if ((uVar16 == 1) && (p_Var8[uVar19].digest_defined != '\0')) {
            *puVar5 = '\x01';
            puVar5 = puVar5 + 1;
            *puVar13 = p_Var8[uVar19].digest;
            puVar13 = puVar13 + 1;
          }
          else {
            lVar21 = (long)iVar4;
            for (uVar14 = 0; uVar14 < uVar16; uVar14 = uVar14 + 1) {
              *puVar5 = local_58.defineds[lVar21];
              puVar5 = puVar5 + 1;
              *puVar13 = local_58.digests[lVar21];
              puVar13 = puVar13 + 1;
              lVar21 = lVar21 + 1;
              uVar16 = p_Var8[uVar19].numUnpackStreams;
            }
            iVar4 = iVar4 + uVar14;
          }
        }
        free_Digest(&local_58);
        puVar5 = header_bytes(a,1);
        if (puVar5 == (uchar *)0x0) {
          return -1;
        }
        uVar23 = *puVar5;
      }
      if (uVar23 != '\0') {
        return -1;
      }
      puVar5 = header_bytes(a,1);
      if (puVar5 == (uchar *)0x0) {
        return -1;
      }
      uVar23 = *puVar5;
    }
    return -(uint)(uVar23 != '\0');
  }
  (si->ci).numFolders = 0;
  (si->ci).folders = (_7z_folder *)0x0;
  (si->ci).dataStreamIndex = 0;
  local_58.defineds = (uchar *)0x0;
  local_58.digests = (uint32_t *)0x0;
  puVar5 = header_bytes(a,1);
  if ((puVar5 != (uchar *)0x0) && (*puVar5 == '\v')) {
    val = &si->ci;
    iVar4 = parse_7zip_uint64(a,&val->numFolders);
    if (-1 < iVar4) {
      if (1000000 < val->numFolders) {
        return -1;
      }
      puVar5 = header_bytes(a,1);
      if (puVar5 != (uchar *)0x0) {
        if (*puVar5 == '\x01') {
          puVar12 = &(si->ci).dataStreamIndex;
          iVar4 = parse_7zip_uint64(a,puVar12);
          if (iVar4 < 0) {
            return -1;
          }
          if (1000000 < *puVar12) {
            return -1;
          }
        }
        else if (*puVar5 == '\0') {
          sVar22 = (si->ci).numFolders;
          p_Var8 = (_7z_folder *)calloc(sVar22,0x68);
          (si->ci).folders = p_Var8;
          if (p_Var8 == (_7z_folder *)0x0) {
            return -1;
          }
          uVar14 = 0;
          while (uVar17 = (ulong)uVar14, uVar17 < sVar22) {
            p_Var3 = (si->ci).folders;
            p_Var8 = p_Var3 + uVar17;
            local_38 = a->format->data;
            p_Var3[uVar17].numUnpackStreams = 0;
            (&p_Var3[uVar17].numUnpackStreams)[1] = 0;
            p_Var3[uVar17].unPackSize = (uint64_t *)0x0;
            (&p_Var3[uVar17].unPackSize)[1] = (uint64_t *)0x0;
            p_Var3[uVar17].numInStreams = 0;
            (&p_Var3[uVar17].numInStreams)[1] = 0;
            p_Var3[uVar17].numPackedStreams = 0;
            (&p_Var3[uVar17].numPackedStreams)[1] = 0;
            p_Var3[uVar17].numBindPairs = 0;
            (&p_Var3[uVar17].numBindPairs)[1] = 0;
            p_Var3[uVar17].numCoders = 0;
            p_Var3[uVar17].coders = (_7z_coder *)0x0;
            p_Var3[uVar17].skipped_bytes = 0;
            local_40 = uVar17;
            iVar4 = parse_7zip_uint64(a,&p_Var8->numCoders);
            if ((iVar4 < 0) || (uVar17 = p_Var8->numCoders, 4 < uVar17)) goto LAB_001827e6;
            p_Var9 = (_7z_coder *)calloc(uVar17,0x28);
            p_Var8->coders = p_Var9;
            if (p_Var9 == (_7z_coder *)0x0) goto LAB_001827e6;
            uVar16 = 0;
            uVar19 = 0;
            for (uVar14 = 0; uVar20 = (ulong)uVar14, uVar20 < uVar17; uVar14 = uVar14 + 1) {
              pbVar10 = header_bytes(a,1);
              if ((pbVar10 == (byte *)0x0) || (bVar1 = *pbVar10, (char)bVar1 < '\0'))
              goto LAB_001827e6;
              puVar5 = header_bytes(a,(ulong)(bVar1 & 0xf));
              if (puVar5 == (uchar *)0x0) goto LAB_001827e6;
              uVar17 = 0;
              for (uVar18 = 0; (bVar1 & 0xf) != uVar18; uVar18 = uVar18 + 1) {
                uVar17 = uVar17 << 8 | (ulong)puVar5[uVar18];
              }
              p_Var9 = p_Var8->coders;
              puVar12 = &p_Var9[uVar20].numInStreams;
              p_Var9[uVar20].codec = uVar17;
              if ((bVar1 & 0x10) == 0) {
                *puVar12 = 1;
                p_Var9[uVar20].numOutStreams = 1;
              }
              else {
                iVar4 = parse_7zip_uint64(a,puVar12);
                if ((((iVar4 < 0) || (1000000 < p_Var8->coders[uVar20].numInStreams)) ||
                    (iVar4 = parse_7zip_uint64(a,&p_Var8->coders[uVar20].numOutStreams), iVar4 < 0))
                   || (p_Var9 = p_Var8->coders, 1000000 < p_Var9[uVar20].numOutStreams))
                goto LAB_001827e6;
              }
              if ((bVar1 & 0x20) != 0) {
                iVar4 = parse_7zip_uint64(a,&p_Var9[uVar20].propertiesSize);
                if ((iVar4 < 0) ||
                   (puVar5 = header_bytes(a,p_Var8->coders[uVar20].propertiesSize),
                   puVar5 == (uchar *)0x0)) goto LAB_001827e6;
                p_Var9 = p_Var8->coders;
                sVar22 = p_Var9[uVar20].propertiesSize;
                __dest = (uchar *)malloc(sVar22);
                p_Var9[uVar20].properties = __dest;
                if (__dest == (uchar *)0x0) goto LAB_001827e6;
                memcpy(__dest,puVar5,sVar22);
              }
              uVar19 = uVar19 + p_Var9[uVar20].numInStreams;
              uVar16 = uVar16 + p_Var9[uVar20].numOutStreams;
              uVar17 = p_Var8->numCoders;
            }
            if (((uVar16 == 0) || (sVar22 = uVar16 - 1, uVar19 < sVar22)) ||
               (p_Var8->numBindPairs = sVar22, *(ulong *)((long)local_38 + 0x70) < sVar22))
            goto LAB_001827e6;
            if (sVar22 == 0) {
              p_Var8->bindPairs = (anon_struct_16_2_4d417c8e *)0x0;
              paVar11 = (anon_struct_16_2_4d417c8e *)0x0;
            }
            else {
              paVar11 = (anon_struct_16_2_4d417c8e *)calloc(sVar22,0x10);
              p_Var8->bindPairs = paVar11;
              if (paVar11 == (anon_struct_16_2_4d417c8e *)0x0) goto LAB_001827e6;
            }
            uVar14 = 0;
            while( true ) {
              uVar20 = (ulong)uVar14;
              uVar17 = p_Var8->numBindPairs;
              if (uVar17 <= uVar20) break;
              iVar4 = parse_7zip_uint64(a,&paVar11[uVar20].inIndex);
              if (((iVar4 < 0) || (1000000 < p_Var8->bindPairs[uVar20].inIndex)) ||
                 (iVar4 = parse_7zip_uint64(a,&p_Var8->bindPairs[uVar20].outIndex), iVar4 < 0))
              goto LAB_001827e6;
              paVar11 = p_Var8->bindPairs;
              uVar14 = uVar14 + 1;
              if (1000000 < paVar11[uVar20].outIndex) goto LAB_001827e6;
            }
            sVar22 = uVar19 - uVar17;
            p_Var8->numPackedStreams = sVar22;
            puVar12 = (uint64_t *)calloc(sVar22,8);
            p_Var8->packedStreams = puVar12;
            if (puVar12 == (uint64_t *)0x0) goto LAB_001827e6;
            if (sVar22 == 1) {
              uVar20 = 0;
              do {
                uVar18 = uVar20;
                if (uVar19 <= uVar18) break;
                uVar20 = 0;
                do {
                  uVar24 = uVar20;
                  if (uVar17 <= uVar24) break;
                  uVar20 = (ulong)((int)uVar24 + 1);
                } while (paVar11[uVar24].inIndex != uVar18);
                uVar20 = (ulong)((int)uVar18 + 1);
              } while (uVar17 != uVar24);
              if (uVar19 == uVar18) goto LAB_001827e6;
              *puVar12 = uVar18;
            }
            else {
              uVar14 = 0;
              while (uVar17 = (ulong)uVar14, uVar17 < p_Var8->numPackedStreams) {
                iVar4 = parse_7zip_uint64(a,puVar12 + uVar17);
                if (iVar4 < 0) goto LAB_001827e6;
                puVar12 = p_Var8->packedStreams;
                uVar14 = uVar14 + 1;
                if (1000000 < puVar12[uVar17]) goto LAB_001827e6;
              }
            }
            p_Var8->numInStreams = uVar19;
            p_Var8->numOutStreams = uVar16;
            sVar22 = val->numFolders;
            uVar14 = (int)local_40 + 1;
          }
        }
        puVar5 = header_bytes(a,1);
        if ((puVar5 != (uchar *)0x0) && (*puVar5 == '\f')) {
          for (uVar14 = 0; uVar17 = (ulong)uVar14, uVar17 < val->numFolders; uVar14 = uVar14 + 1) {
            p_Var8 = (si->ci).folders;
            puVar12 = (uint64_t *)calloc(p_Var8[uVar17].numOutStreams,8);
            p_Var8[uVar17].unPackSize = puVar12;
            if (puVar12 == (uint64_t *)0x0) goto LAB_001827e6;
            uVar19 = 0;
            while (uVar19 < p_Var8[uVar17].numOutStreams) {
              iVar4 = parse_7zip_uint64(a,p_Var8[uVar17].unPackSize + uVar19);
              uVar19 = (ulong)((int)uVar19 + 1);
              if (iVar4 < 0) goto LAB_001827e6;
            }
          }
          puVar5 = header_bytes(a,1);
          if (puVar5 != (uchar *)0x0) {
            if (*puVar5 == '\n') {
              iVar4 = read_Digests(a,&local_58,val->numFolders);
              if (iVar4 < 0) goto LAB_001827e6;
              uVar17 = val->numFolders;
              for (uVar14 = 0; uVar19 = (ulong)uVar14, uVar19 < uVar17; uVar14 = uVar14 + 1) {
                p_Var8 = (si->ci).folders;
                p_Var8[uVar19].digest_defined = local_58.defineds[uVar19];
                p_Var8[uVar19].digest = local_58.digests[uVar19];
              }
              puVar5 = header_bytes(a,1);
              if ((puVar5 == (uchar *)0x0) || (*puVar5 != '\0')) goto LAB_001827e6;
              free_Digest(&local_58);
            }
            else if (*puVar5 != '\0') goto LAB_001827e6;
            uVar17 = (si->ci).numFolders;
            p_Var8 = (si->ci).folders;
            uVar14 = 0;
            uVar19 = 0;
            while (uVar20 = (ulong)uVar14, uVar20 < uVar17) {
              p_Var8[uVar20].packIndex = (uint32_t)uVar19;
              uVar19 = (ulong)((uint32_t)uVar19 + (int)p_Var8[uVar20].numPackedStreams);
              uVar14 = uVar14 + 1;
              if ((si->pi).numPackStreams < uVar19) {
                return -1;
              }
            }
            puVar5 = header_bytes(a,1);
            if (puVar5 == (uchar *)0x0) {
              return -1;
            }
            uVar23 = *puVar5;
            goto LAB_00182812;
          }
        }
      }
    }
  }
LAB_001827e6:
  free_Digest(&local_58);
  return -1;
}

Assistant:

static int
read_StreamsInfo(struct archive_read *a, struct _7z_stream_info *si)
{
	struct _7zip *zip = (struct _7zip *)a->format->data;
	const unsigned char *p;
	unsigned i;

	memset(si, 0, sizeof(*si));

	if ((p = header_bytes(a, 1)) == NULL)
		return (-1);
	if (*p == kPackInfo) {
		uint64_t packPos;

		if (read_PackInfo(a, &(si->pi)) < 0)
			return (-1);

		if (si->pi.positions == NULL || si->pi.sizes == NULL)
			return (-1);
		/*
		 * Calculate packed stream positions.
		 */
		packPos = si->pi.pos;
		for (i = 0; i < si->pi.numPackStreams; i++) {
			si->pi.positions[i] = packPos;
			packPos += si->pi.sizes[i];
			if (packPos > zip->header_offset)
				return (-1);
		}
		if ((p = header_bytes(a, 1)) == NULL)
			return (-1);
	}
	if (*p == kUnPackInfo) {
		uint32_t packIndex;
		struct _7z_folder *f;

		if (read_CodersInfo(a, &(si->ci)) < 0)
			return (-1);

		/*
		 * Calculate packed stream indexes.
		 */
		packIndex = 0;
		f = si->ci.folders;
		for (i = 0; i < si->ci.numFolders; i++) {
			f[i].packIndex = packIndex;
			packIndex += (uint32_t)f[i].numPackedStreams;
			if (packIndex > si->pi.numPackStreams)
				return (-1);
		}
		if ((p = header_bytes(a, 1)) == NULL)
			return (-1);
	}

	if (*p == kSubStreamsInfo) {
		if (read_SubStreamsInfo(a, &(si->ss),
		    si->ci.folders, (size_t)si->ci.numFolders) < 0)
			return (-1);
		if ((p = header_bytes(a, 1)) == NULL)
			return (-1);
	}

	/*
	 *  Must be kEnd.
	 */
	if (*p != kEnd)
		return (-1);
	return (0);
}